

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O1

size_t ts_subtree__write_to_string
                 (Subtree self,char *string,size_t limit,TSLanguage *language,_Bool is_root,
                 _Bool include_all,TSSymbol alias_symbol,_Bool alias_is_named)

{
  Subtree self_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ushort **ppuVar5;
  char *pcVar6;
  char *pcVar7;
  TSSymbol *pTVar8;
  char cVar9;
  byte bVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (self.ptr == (SubtreeHeapData *)0x0) {
    iVar1 = snprintf(string,limit,"(NULL)");
    return (long)iVar1;
  }
  cVar9 = '\x01';
  if (!is_root && !include_all) {
    if (((ulong)self.ptr & 1) == 0) {
      uVar2 = *(uint *)&(self.ptr)->field_0x2c >> 7;
    }
    else {
      uVar2 = (uint)((ulong)self.ptr >> 5) & 0x7ffffff;
    }
    if ((uVar2 & 1) == 0) {
      if (((ulong)self.ptr & 1) == 0) {
        uVar2 = (uint)*(ushort *)&(self.ptr)->field_0x2c;
      }
      else {
        uVar2 = (uint)((ulong)self.ptr >> 1) & 0x7fffffff;
      }
      if ((uVar2 & 1) != 0) {
        if (((ulong)self.ptr & 1) == 0) {
          uVar2 = *(uint *)&(self.ptr)->field_0x2c >> 1;
        }
        else {
          uVar2 = (uint)((ulong)self.ptr >> 2) & 0x3fffffff;
        }
        if ((uVar2 & 1) != 0) goto LAB_00133880;
      }
      cVar9 = alias_is_named;
    }
  }
LAB_00133880:
  pcVar12 = string;
  if (cVar9 == '\x01' && !is_root) {
    iVar1 = snprintf(string,limit," ");
    pcVar12 = string + iVar1;
  }
  if (cVar9 == '\0') goto LAB_00133a0f;
  if (((ulong)self.ptr & 1) == 0) {
    if (((self.ptr)->symbol == 0xffff) &&
       (((((ulong)self.ptr & 1) != 0 || ((self.ptr)->child_count == 0)) &&
        (((self.ptr)->size).bytes != 0)))) {
      pcVar6 = pcVar12;
      if (limit == 0) {
        pcVar6 = string;
      }
      iVar1 = snprintf(pcVar6,limit,"(UNEXPECTED ");
      pcVar6 = pcVar12 + iVar1;
      if (limit == 0) {
        pcVar6 = string;
      }
      uVar2 = ((self.ptr)->field_17).lookahead_char;
      if ((long)(int)uVar2 < 9) {
        if (uVar2 == 0xffffffff) {
          pcVar7 = "INVALID";
          goto LAB_00133b88;
        }
        if (uVar2 == 0) {
          pcVar7 = "EOF";
          goto LAB_00133b88;
        }
LAB_00133ba1:
        if ((uVar2 < 0x80) &&
           (ppuVar5 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar5 + (long)(int)uVar2 * 2 + 1) & 0x40) != 0)) {
          pcVar7 = "consume character:\'%c\'";
        }
        else {
          pcVar7 = "consume character:%d";
        }
        iVar3 = snprintf(pcVar6,limit,pcVar7 + 0x12,(ulong)uVar2);
      }
      else {
        if (uVar2 == 9) {
          pcVar7 = "\'\\t\'";
        }
        else if (uVar2 == 10) {
          pcVar7 = "\'\\n\'";
        }
        else {
          if (uVar2 != 0xd) goto LAB_00133ba1;
          pcVar7 = "\'\\r\'";
        }
LAB_00133b88:
        iVar3 = snprintf(pcVar6,limit,pcVar7);
      }
      pcVar12 = pcVar12 + iVar1 + iVar3;
      goto LAB_00133a0f;
    }
    if (((ulong)self.ptr & 1) != 0) goto LAB_001338d7;
    uVar2 = *(uint *)&(self.ptr)->field_0x2c >> 7;
  }
  else {
LAB_001338d7:
    uVar2 = (uint)((ulong)self.ptr >> 5) & 0x7ffffff;
  }
  if ((uVar2 & 1) == 0) {
    if (alias_symbol == 0) {
      if (((ulong)self.ptr & 1) == 0) {
        alias_symbol = (self.ptr)->symbol;
      }
      else {
        alias_symbol = (TSSymbol)self.data.symbol;
      }
    }
    if (alias_symbol == 0xffff) {
      pcVar6 = "ERROR";
    }
    else if (alias_symbol == 0xfffe) {
      pcVar6 = "_ERROR";
    }
    else {
      pcVar6 = language->symbol_names[alias_symbol];
    }
    pcVar7 = pcVar12;
    if (limit == 0) {
      pcVar7 = string;
    }
    iVar1 = snprintf(pcVar7,limit,"(%s",pcVar6);
    pcVar12 = pcVar12 + iVar1;
  }
  else {
    pcVar6 = pcVar12;
    if (limit == 0) {
      pcVar6 = string;
    }
    iVar1 = snprintf(pcVar6,limit,"(MISSING");
    pcVar12 = pcVar12 + iVar1;
  }
LAB_00133a0f:
  if ((((ulong)self.ptr & 1) == 0) && ((self.ptr)->child_count != 0)) {
    uVar13 = (ulong)((self.ptr)->field_17).field_0.alias_sequence_id;
    if (uVar13 == 0) {
      pTVar8 = (TSSymbol *)0x0;
    }
    else {
      pTVar8 = language->alias_sequences + language->max_alias_sequence_length * uVar13;
    }
    if ((self.ptr)->child_count != 0) {
      uVar13 = 0;
      uVar14 = 0;
      do {
        self_00 = ((self.ptr)->field_17).field_0.children[uVar13];
        if (((ulong)self_00.ptr & 1) == 0) {
          uVar2 = *(uint *)&(self_00.ptr)->field_0x2c >> 2;
        }
        else {
          uVar2 = (uint)((ulong)self_00.ptr >> 3) & 0x1fffffff;
        }
        if ((uVar2 & 1) == 0) {
          if (pTVar8 == (TSSymbol *)0x0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)pTVar8[uVar14];
          }
          bVar10 = (byte)uVar11;
          pcVar6 = pcVar12;
          if (limit == 0) {
            pcVar6 = string;
          }
          if (2 < (ushort)((TSSymbol)uVar11 + 2)) {
            bVar10 = ((byte)language->symbol_metadata[uVar11] & 2) >> 1;
          }
          sVar4 = ts_subtree__write_to_string
                            (self_00,pcVar6,limit,language,false,include_all,(TSSymbol)uVar11,
                             (_Bool)(bVar10 & 1));
          uVar14 = (ulong)((int)uVar14 + 1);
        }
        else {
          pcVar6 = pcVar12;
          if (limit == 0) {
            pcVar6 = string;
          }
          sVar4 = ts_subtree__write_to_string
                            (self_00,pcVar6,limit,language,false,include_all,0,false);
        }
        pcVar12 = pcVar12 + sVar4;
        uVar13 = uVar13 + 1;
      } while (uVar13 < (self.ptr)->child_count);
    }
  }
  if (cVar9 != '\0') {
    pcVar6 = pcVar12;
    if (limit == 0) {
      pcVar6 = string;
    }
    iVar1 = snprintf(pcVar6,limit,")");
    pcVar12 = pcVar12 + iVar1;
  }
  return (long)pcVar12 - (long)string;
}

Assistant:

static size_t ts_subtree__write_to_string(Subtree self, char *string, size_t limit,
                                          const TSLanguage *language, bool is_root,
                                          bool include_all, TSSymbol alias_symbol,
                                          bool alias_is_named) {
  if (!self.ptr) return snprintf(string, limit, "(NULL)");

  char *cursor = string;
  char **writer = (limit > 0) ? &cursor : &string;
  bool visible =
    include_all ||
    is_root ||
    ts_subtree_missing(self) ||
    (ts_subtree_visible(self) && ts_subtree_named(self)) ||
    alias_is_named;

  if (visible && !is_root) {
    cursor += snprintf(*writer, limit, " ");
  }

  if (visible) {
    if (ts_subtree_is_error(self) && ts_subtree_child_count(self) == 0 && self.ptr->size.bytes > 0) {
      cursor += snprintf(*writer, limit, "(UNEXPECTED ");
      cursor += ts_subtree__write_char_to_string(*writer, limit, self.ptr->lookahead_char);
    } else if (ts_subtree_missing(self)) {
      cursor += snprintf(*writer, limit, "(MISSING");
    } else {
      TSSymbol symbol = alias_symbol ? alias_symbol : ts_subtree_symbol(self);
      const char *symbol_name = ts_language_symbol_name(language, symbol);
      cursor += snprintf(*writer, limit, "(%s", symbol_name);
    }
  }

  if (ts_subtree_child_count(self)) {
    const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      if (ts_subtree_extra(child)) {
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          0, false
        );
      } else {
        TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          alias_symbol,
          alias_symbol ? ts_language_symbol_metadata(language, alias_symbol).named : false
        );
        structural_child_index++;
      }
    }
  }

  if (visible) cursor += snprintf(*writer, limit, ")");

  return cursor - string;
}